

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O3

int __thiscall CConsoleNetConnection::Recv(CConsoleNetConnection *this,char *pLine,int MaxLength)

{
  char *dest;
  char *source;
  long lVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  uint size;
  long lVar10;
  
  if (this->m_State != 4) {
    return 0;
  }
  uVar3 = this->m_BufferOffset;
  lVar7 = (long)(int)uVar3;
  if (lVar7 == 0) {
    return 0;
  }
  dest = this->m_aBuffer;
  bVar9 = this->m_LineEndingDetected;
  uVar5 = 1;
  if (1 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  uVar8 = 0;
  do {
    source = dest + uVar8;
    cVar2 = dest[uVar8];
    if ((cVar2 != '\n') && (cVar2 != '\r')) {
      lVar10 = 0;
      goto LAB_0013ae83;
    }
    if ((bVar9 & 1) == 0) {
      this->m_aLineEnding[0] = cVar2;
      if (((long)(uVar8 + 1) < lVar7) &&
         (((cVar2 = dest[uVar8 + 1], cVar2 == '\r' || (cVar2 == '\n')) && (*source != cVar2)))) {
        this->m_aLineEnding[1] = cVar2;
      }
      this->m_LineEndingDetected = true;
      bVar9 = 1;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != uVar5);
  iVar6 = 0;
  goto LAB_0013ae61;
  while (lVar1 = lVar10 + uVar8, lVar10 = lVar10 + 1, lVar1 + 1 < lVar7) {
LAB_0013ae83:
    iVar6 = (int)uVar8;
    if ((this->m_aBuffer[lVar10 + uVar8] == '\n') || (this->m_aBuffer[lVar10 + uVar8] == '\r')) {
      size = (uint)lVar10;
      if ((int)size < MaxLength) {
        mem_copy(pLine,source,size);
        pLine[(int)size] = '\0';
        str_sanitize_cc(pLine);
        mem_move(dest,this->m_aBuffer + lVar10 + uVar8,(this->m_BufferOffset - iVar6) - size);
        iVar6 = (this->m_BufferOffset - iVar6) - size;
        iVar4 = 1;
        goto LAB_0013ae63;
      }
      break;
    }
  }
  if (uVar8 == 0) {
    return 0;
  }
  mem_move(dest,source,uVar3 - iVar6);
  iVar6 = this->m_BufferOffset - iVar6;
LAB_0013ae61:
  iVar4 = 0;
LAB_0013ae63:
  this->m_BufferOffset = iVar6;
  return iVar4;
}

Assistant:

int CConsoleNetConnection::Recv(char *pLine, int MaxLength)
{
	if(State() == NET_CONNSTATE_ONLINE)
	{
		if(m_BufferOffset)
		{
			// find message start
			int StartOffset = 0;
			while(m_aBuffer[StartOffset] == '\r' || m_aBuffer[StartOffset] == '\n')
			{
				// detect clients line ending format
				if(!m_LineEndingDetected)
				{
					m_aLineEnding[0] = m_aBuffer[StartOffset];
					if(StartOffset+1 < m_BufferOffset && (m_aBuffer[StartOffset+1] == '\r' || m_aBuffer[StartOffset+1] == '\n') &&
						m_aBuffer[StartOffset] != m_aBuffer[StartOffset+1])
						m_aLineEnding[1] = m_aBuffer[StartOffset+1];
					m_LineEndingDetected = true;
				}

				if(++StartOffset >= m_BufferOffset)
				{
					m_BufferOffset = 0;
					return 0;
				}
			}

			// find message end
			int EndOffset = StartOffset;
			while(m_aBuffer[EndOffset] != '\r' && m_aBuffer[EndOffset] != '\n')
			{
				if(++EndOffset >= m_BufferOffset)
				{
					if(StartOffset > 0)
					{
						mem_move(m_aBuffer, m_aBuffer+StartOffset, m_BufferOffset-StartOffset);
						m_BufferOffset -= StartOffset;
					}
					return 0;
				}
			}

			// extract message and update buffer
			if(MaxLength-1 < EndOffset-StartOffset)
			{
				if(StartOffset > 0)
				{
					mem_move(m_aBuffer, m_aBuffer+StartOffset, m_BufferOffset-StartOffset);
					m_BufferOffset -= StartOffset;
				}
				return 0;
			}
			mem_copy(pLine, m_aBuffer+StartOffset, EndOffset-StartOffset);
			pLine[EndOffset-StartOffset] = 0;
			str_sanitize_cc(pLine);
			mem_move(m_aBuffer, m_aBuffer+EndOffset, m_BufferOffset-EndOffset);
			m_BufferOffset -= EndOffset;
			return 1;
		}
	}
	return 0;
}